

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_op.hpp
# Opt level: O3

void asio::detail::
     resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  addrinfo_type *address_info;
  short *psVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 this;
  int error;
  int *piVar7;
  undefined8 *puVar8;
  OutputWorker *pOVar9;
  in_addr_t iVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R13;
  func_type *pp_Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__name;
  bool bVar12;
  error_code eVar13;
  string local_268;
  address local_248;
  undefined1 local_228 [16];
  operation *poStack_218;
  func_type *local_210;
  scheduler_operation *local_208;
  func_type p_Stack_200;
  undefined1 local_1f8 [8];
  anon_union_16_3_a3f0114d_for___in6_u aStack_1f0;
  data_union local_1d4;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_228._0_8_ = &base[6].task_result_;
  poStack_218 = base;
  local_228._8_8_ = base;
  if ((owner == (void *)0x0) || (base[6].func_ == (func_type)owner)) {
    local_210 = *(func_type **)&base[6].task_result_;
    local_228._0_8_ = &local_210;
    local_208 = base[7].next_;
    p_Stack_200 = base[7].func_;
    aStack_1f0._8_8_ = 0;
    _local_1f8 = (undefined1  [16])0x0;
    address_info = *(addrinfo_type **)&base[7].task_result_;
    if (address_info != (addrinfo_type *)0x0) {
      local_1b8._0_8_ = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,*(long *)&base[3].task_result_,
                 (long)&(base[4].next_)->next_ + *(long *)&base[3].task_result_);
      unaff_R13 = &local_268.field_2;
      local_268._M_dataplus._M_p = (pointer)unaff_R13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,base[5].next_,base[5].func_ + (long)base[5].next_);
      ip::basic_resolver_results<asio::ip::tcp>::create
                ((basic_resolver_results<asio::ip::tcp> *)&local_248,address_info,
                 (string *)local_1b8,&local_268);
      uVar2 = local_248._0_8_;
      uVar5 = local_248.ipv6_address_.addr_.__in6_u._0_8_;
      this = aStack_1f0._0_8_;
      local_248.type_ = ipv4;
      local_248.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      uVar4 = local_248._0_8_;
      uVar6 = local_248.ipv6_address_.addr_.__in6_u._8_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_248.ipv6_address_.addr_.__in6_u._8_8_;
      local_248.ipv6_address_.addr_.__in6_u = (anon_union_16_3_a3f0114d_for___in6_u)(auVar3 << 0x40)
      ;
      aStack_1f0._0_8_ = uVar5;
      local_248.type_ = (anon_enum_32)uVar2;
      local_248.ipv4_address_.addr_.s_addr = SUB84(uVar2,4);
      local_1f8._0_4_ = local_248.type_;
      local_1f8._4_4_ = local_248.ipv4_address_.addr_.s_addr;
      local_248._0_8_ = uVar4;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_248.ipv6_address_.addr_.__in6_u = (anon_union_16_3_a3f0114d_for___in6_u)ZEXT816(0);
        aStack_1f0._8_8_ = uVar6;
      }
      else {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
        aStack_1f0._8_8_ = local_248.ipv6_address_.addr_.__in6_u._8_8_;
        local_248.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_248.ipv6_address_.addr_.__in6_u._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_248.ipv6_address_.addr_.__in6_u._0_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != unaff_R13) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    iVar10 = (in_addr_t)unaff_R13;
    ptr::reset((ptr *)local_228);
    pp_Var11 = local_210;
    if (owner != (void *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1f0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(aStack_1f0._0_8_ + 8) = *(_Atomic_word *)(aStack_1f0._0_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(aStack_1f0._0_8_ + 8) = *(_Atomic_word *)(aStack_1f0._0_8_ + 8) + 1;
        }
      }
      local_1b8._0_8_ = local_1f8;
      local_1b8._8_8_ = aStack_1f0._0_8_;
      local_1a8[0]._M_allocated_capacity = 0;
      if (local_1f8 == (undefined1  [8])0x0) {
        bVar12 = true;
      }
      else {
        iVar10 = 0x100007f;
        psVar1 = *(short **)local_1f8;
        if (*psVar1 == 2) {
          iVar10 = *(in_addr_t *)(psVar1 + 2);
          bVar12 = false;
        }
        else {
          uVar2 = vpcmpb_avx512vl(_DAT_00113530,*(undefined1 (*) [16])(psVar1 + 4),4);
          bVar12 = (short)uVar2 != 0;
          if (bVar12) {
            local_268._M_dataplus._M_p = (pointer)&PTR__bad_cast_0011bc48;
            puVar8 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar8 = &PTR__bad_cast_0011bc48;
            __cxa_throw(puVar8,&ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
          }
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1f0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1f0._0_8_);
      }
      if (bVar12 || iVar10 == 0) {
        if (*(int *)(pp_Var11 + 1) < 5) {
          local_1b8._0_8_ = *pp_Var11;
          local_1b8._8_4_ = 4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8[0]._M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,(char *)pp_Var11[7],(long)pp_Var11[8]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,"Unable to resolve server hostname: ",0x23
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,(char *)pp_Var11[0x5f],
                     (long)pp_Var11[0x60]);
          pOVar9 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8[0]._M_local_buf);
          std::ios_base::~ios_base(local_138);
        }
        LOCK();
        *(undefined4 *)(pp_Var11 + 0x4c) = 3;
        UNLOCK();
      }
      else {
        local_1d4.v6.sin6_addr.__in6_u = (in6_addr)(anon_union_16_3_a3f0114d_for___in6_u)0x0;
        local_1d4.v6.sin6_scope_id = 0;
        local_1d4.base.sa_family = 2;
        local_1d4.v4.sin_port = swap_bytes(*(undefined2 *)(pp_Var11 + 99));
        local_1d4.v6.sin6_flowinfo = iVar10;
        mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                  ((LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_> *)(pp_Var11 + 0x77),
                   (basic_endpoint<asio::ip::udp> *)&local_1d4.base);
        mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
                  ((LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_> *)(pp_Var11 + 0x82),
                   (basic_endpoint<asio::ip::udp> *)&local_1d4.base);
        if (local_1d4.base.sa_family != 2) {
          local_248.ipv6_address_.scope_id_ = (unsigned_long)local_1d4.v6.sin6_scope_id;
          local_248.ipv6_address_.addr_.__in6_u =
               (anon_union_16_3_a3f0114d_for___in6_u)local_1d4.v6.sin6_addr.__in6_u;
          local_248.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          local_248.ipv6_address_.scope_id_ = 0;
          local_248.ipv6_address_.addr_.__in6_u = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
          local_248.ipv4_address_.addr_.s_addr =
               (in4_addr_type)(in4_addr_type)local_1d4.v6.sin6_flowinfo;
        }
        local_248.type_ = (uint)(local_1d4.base.sa_family != 2);
        ip::address::to_string_abi_cxx11_(&local_268,&local_248);
        if (*(int *)(pp_Var11 + 1) < 3) {
          local_1b8._0_8_ = *pp_Var11;
          swap_bytes(local_1d4.v4.sin_port);
          local_1b8._8_4_ = 2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8[0]._M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,(char *)pp_Var11[7],(long)pp_Var11[8]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,"Resolved server address to ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,local_268._M_dataplus._M_p,
                     local_268._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf," : ",3);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          pOVar9 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8[0]._M_local_buf);
          std::ios_base::~ios_base(local_138);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p);
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1f0._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_1f0._0_8_);
    }
  }
  else {
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,*(long *)&base[3].task_result_,
               (long)&(base[4].next_)->next_ + *(long *)&base[3].task_result_);
    uVar2 = local_1b8._0_8_;
    local_210 = &p_Stack_200;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,base[5].next_,base[5].func_ + (long)base[5].next_);
    if ((base[1].func_ == (func_type)0x0) || (*(int *)(base[1].func_ + 8) == 0)) {
      std::error_code::operator=((error_code *)(base + 7),operation_aborted);
    }
    else {
      __name = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)uVar2 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) && (*(char *)uVar2 != '\0')) {
        __name = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar2;
      }
      pp_Var11 = (func_type *)0x0;
      if ((local_210 != (func_type *)0x0) && (*(char *)local_210 != '\0')) {
        pp_Var11 = local_210;
      }
      piVar7 = __errno_location();
      *piVar7 = 0;
      error = getaddrinfo(__name->_M_local_buf,(char *)pp_Var11,(addrinfo *)&base[1].task_result_,
                          (addrinfo **)&base[7].task_result_);
      eVar13 = socket_ops::translate_addrinfo_error(error);
      *(int *)&base[7].next_ = eVar13._M_value;
      base[7].func_ = (func_type)eVar13._M_cat;
    }
    if (local_210 != &p_Stack_200) {
      operator_delete(local_210);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != local_1a8) {
      operator_delete((void *)local_1b8._0_8_);
    }
    scheduler::post_deferred_completion((scheduler *)base[6].func_,base);
    stack0xfffffffffffffde0 = (undefined1  [16])0x0;
  }
  ptr::reset((ptr *)local_228);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the operation object.
    resolve_op* o(static_cast<resolve_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    if (owner && owner != &o->io_context_impl_)
    {
      // The operation is being run on the worker io_context. Time to perform
      // the resolver operation.
    
      // Perform the blocking host resolution operation.
      socket_ops::background_getaddrinfo(o->cancel_token_,
          o->query_.host_name().c_str(), o->query_.service_name().c_str(),
          o->query_.hints(), &o->addrinfo_, o->ec_);

      // Pass operation back to main io_context for completion.
      o->io_context_impl_.post_deferred_completion(o);
      p.v = p.p = 0;
    }
    else
    {
      // The operation has been returned to the main io_context. The completion
      // handler is ready to be delivered.

      ASIO_HANDLER_COMPLETION((*o));

      // Make a copy of the handler so that the memory can be deallocated
      // before the upcall is made. Even if we're not about to make an upcall,
      // a sub-object of the handler may be the true owner of the memory
      // associated with the handler. Consequently, a local copy of the handler
      // is required to ensure that any owning sub-object remains valid until
      // after we have deallocated the memory here.
      detail::binder2<Handler, asio::error_code, results_type>
        handler(o->handler_, o->ec_, results_type());
      p.h = asio::detail::addressof(handler.handler_);
      if (o->addrinfo_)
      {
        handler.arg2_ = results_type::create(o->addrinfo_,
            o->query_.host_name(), o->query_.service_name());
      }
      p.reset();

      if (owner)
      {
        fenced_block b(fenced_block::half);
        ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, "..."));
        w.complete(handler, handler.handler_);
        ASIO_HANDLER_INVOCATION_END;
      }
    }
  }